

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ManPrintQuit(Lf_Man_t *p,Gia_Man_t *pNew)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  abctime aVar9;
  double dVar10;
  double dVar11;
  double local_68;
  uint local_34;
  int i;
  float MemMap;
  float MemTt;
  float MemCutsF;
  float MemCutsB;
  float MemMan;
  float MemGia;
  Gia_Man_t *pNew_local;
  Lf_Man_t *p_local;
  
  dVar10 = Gia_ManMemory(p->pGia);
  iVar4 = Gia_ManObjNum(p->pGia);
  iVar5 = Gia_ManAndNotBufNum(p->pGia);
  fVar1 = ((float)(iVar4 * 2 + iVar5 * 3) * 4.0) / 1048576.0;
  iVar4 = (p->vStoreOld).MaskPage;
  iVar5 = Vec_PtrSize(&p->vFreePages);
  iVar6 = Vec_PtrSize(&(p->vStoreOld).vPages);
  iVar7 = Gia_ManAndNotBufNum(p->pGia);
  fVar2 = ((float)(iVar4 + 1) * 1.0 * (float)(iVar5 + iVar6)) / 1048576.0 +
          ((float)iVar7 * 32.0) / 1048576.0;
  iVar4 = p->nSetWords;
  iVar5 = Vec_PtrSize(&p->vMemSets);
  fVar3 = ((float)iVar4 * 8.0 * 4096.0 * (float)iVar5) / 1048576.0;
  if (p->vTtMem == (Vec_Mem_t *)0x0) {
    local_68 = 0.0;
  }
  else {
    local_68 = Vec_MemMemory(p->vTtMem);
    local_68 = local_68 / 1048576.0;
  }
  dVar11 = Vec_IntMemory(pNew->vMapping);
  if ((p->CutCount[0] == 0.0) && (!NAN(p->CutCount[0]))) {
    p->CutCount[0] = 1.0;
  }
  if (p->pPars->fVerbose != 0) {
    printf("CutPair = %.0f  ",p->CutCount[0]);
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    printf("\n");
    printf("Gia = %.2f MB  ",(double)(float)(dVar10 / 1048576.0));
    printf("Man = %.2f MB  ",(double)fVar1);
    printf("Best = %.2f MB  ",(double)fVar2);
    printf("Front = %.2f MB   ",(double)fVar3);
    printf("Map = %.2f MB  ",(double)(float)(dVar11 / 1048576.0));
    printf("TT = %.2f MB  ",(double)(float)local_68);
    printf("Total = %.2f MB",
           (double)((float)(dVar10 / 1048576.0) + fVar1 + fVar2 + fVar3 +
                    (float)(dVar11 / 1048576.0) + (float)local_68));
    printf("\n");
    for (local_34 = 0; (int)local_34 <= p->pPars->nLutSize; local_34 = local_34 + 1) {
      printf("%d:%d  ",(ulong)local_34,(ulong)(uint)p->nCutCounts[(int)local_34]);
    }
    uVar8 = p->nCutEqual;
    iVar4 = p->nCutEqual;
    iVar5 = p->Iter;
    iVar6 = Gia_ManAndNotBufNum(p->pGia);
    printf("Equal = %d (%.0f %%) ",(((double)iVar4 * 100.0) / (double)iVar5) / (double)iVar6,
           (ulong)uVar8);
    if (p->vTtMem != (Vec_Mem_t *)0x0) {
      uVar8 = Vec_MemEntryNum(p->vTtMem);
      iVar4 = Vec_MemEntryNum(p->vTtMem);
      printf("TT = %d (%.2f %%)  ",((double)iVar4 * 100.0) / p->CutCount[2],(ulong)uVar8);
    }
    if ((p->pGia->pMuxes != (uint *)0x0) && (p->nCutMux != 0)) {
      uVar8 = p->nCutMux;
      iVar4 = p->nCutMux;
      iVar5 = p->Iter;
      iVar6 = Gia_ManMuxNum(p->pGia);
      printf("MuxTT = %d (%.0f %%) ",(((double)iVar4 * 100.0) / (double)iVar5) / (double)iVar6,
             (ulong)uVar8);
    }
    printf("\n");
    uVar8 = p->nCoDrivers;
    iVar4 = p->nCoDrivers;
    iVar5 = Gia_ManCoNum(p->pGia);
    printf("CoDrvs = %d (%.2f %%)  ",((double)iVar4 * 100.0) / (double)iVar5,(ulong)uVar8);
    uVar8 = p->nInverters;
    iVar4 = p->nInverters;
    iVar5 = Gia_ManCoNum(p->pGia);
    printf("CoInvs = %d (%.2f %%)  ",((double)iVar4 * 100.0) / (double)iVar5,(ulong)uVar8);
    uVar8 = p->nFrontMax;
    iVar4 = p->nFrontMax;
    iVar5 = Gia_ManAndNum(p->pGia);
    printf("Front = %d (%.2f %%)  ",((double)iVar4 * 100.0) / (double)iVar5,(ulong)uVar8);
    printf("TimeFails = %d   ",(ulong)(uint)p->nTimeFails);
    aVar9 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar9 - p->clkStart);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Lf_ManPrintQuit( Lf_Man_t * p, Gia_Man_t * pNew )
{
    float MemGia   = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan   = 1.0 * sizeof(int) * (2 * Gia_ManObjNum(p->pGia) + 3 * Gia_ManAndNotBufNum(p->pGia)) / (1<<20); // offset, required, cutsets, maprefs, flowrefs
    float MemCutsB = 1.0 * (p->vStoreOld.MaskPage + 1) * (Vec_PtrSize(&p->vFreePages) + Vec_PtrSize(&p->vStoreOld.vPages)) / (1<<20) + 1.0 * sizeof(Lf_Bst_t) * Gia_ManAndNotBufNum(p->pGia) / (1<<20);
    float MemCutsF = 1.0 * sizeof(word) * p->nSetWords * (1<<LF_LOG_PAGE) * Vec_PtrSize(&p->vMemSets) / (1<<20);
    float MemTt    = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    float MemMap   = Vec_IntMemory(pNew->vMapping) / (1<<20);
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
        return;
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
    printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
    printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Best = %.2f MB  ",         MemCutsB );
    printf( "Front = %.2f MB   ",       MemCutsF );
    printf( "Map = %.2f MB  ",          MemMap ); 
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB",          MemGia + MemMan + MemCutsB + MemCutsF + MemMap + MemTt ); 
    printf( "\n" );
    if ( 1 )
    {
        int i;
        for ( i = 0; i <= p->pPars->nLutSize; i++ )
            printf( "%d:%d  ", i, p->nCutCounts[i] );
        printf( "Equal = %d (%.0f %%) ", p->nCutEqual, 100.0 * p->nCutEqual / p->Iter / Gia_ManAndNotBufNum(p->pGia) );
        if ( p->vTtMem )
            printf( "TT = %d (%.2f %%)  ", Vec_MemEntryNum(p->vTtMem), 100.0 * Vec_MemEntryNum(p->vTtMem) / p->CutCount[2] );
        if ( p->pGia->pMuxes && p->nCutMux )
            printf( "MuxTT = %d (%.0f %%) ", p->nCutMux, 100.0 * p->nCutMux / p->Iter / Gia_ManMuxNum(p->pGia) );
        printf( "\n" );
    }
    printf( "CoDrvs = %d (%.2f %%)  ",  p->nCoDrivers, 100.0*p->nCoDrivers/Gia_ManCoNum(p->pGia) );
    printf( "CoInvs = %d (%.2f %%)  ",  p->nInverters, 100.0*p->nInverters/Gia_ManCoNum(p->pGia) );
    printf( "Front = %d (%.2f %%)  ",   p->nFrontMax,  100.0*p->nFrontMax/Gia_ManAndNum(p->pGia) );
    printf( "TimeFails = %d   ",        p->nTimeFails );
    Abc_PrintTime( 1, "Time",    Abc_Clock() - p->clkStart );
    fflush( stdout );
}